

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Swap(ExtensionSet *this,ExtensionSet *x)

{
  ExtensionSet *this_00;
  ExtensionSet *pEVar1;
  ExtensionSet *in_RSI;
  ExtensionSet *in_RDI;
  ExtensionSet *unaff_retaddr;
  ExtensionSet *in_stack_00000010;
  ExtensionSet extension_set;
  ExtensionSet local_28;
  ExtensionSet *local_10;
  ExtensionSet *other;
  
  local_10 = in_RSI;
  other = in_RDI;
  this_00 = (ExtensionSet *)GetArenaNoVirtual(in_RDI);
  pEVar1 = (ExtensionSet *)GetArenaNoVirtual(local_10);
  if (this_00 == pEVar1) {
    std::swap<unsigned_short>(&in_RDI->flat_capacity_,&local_10->flat_capacity_);
    std::swap<unsigned_short>(&in_RDI->flat_size_,&local_10->flat_size_);
    std::swap<google::protobuf::internal::ExtensionSet::AllocatedData>
              (&in_RDI->map_,&local_10->map_);
  }
  else {
    pEVar1 = &local_28;
    ExtensionSet(in_stack_00000010);
    MergeFrom(unaff_retaddr,other);
    Clear(pEVar1);
    MergeFrom(unaff_retaddr,other);
    Clear(pEVar1);
    MergeFrom(unaff_retaddr,other);
    ~ExtensionSet(this_00);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(ExtensionSet* x) {
  if (GetArenaNoVirtual() == x->GetArenaNoVirtual()) {
    using std::swap;
    swap(flat_capacity_, x->flat_capacity_);
    swap(flat_size_, x->flat_size_);
    swap(map_, x->map_);
  } else {
    // TODO(cfallin, rohananil): We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(*x);
    x->Clear();
    x->MergeFrom(*this);
    Clear();
    MergeFrom(extension_set);
  }
}